

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O0

BUFFER_HANDLE Azure_Base64_Decode(char *source)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  size_t size;
  uchar *decodedString;
  LOGGER_LOG l_3;
  size_t sizeOfOutputBuffer;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  BUFFER_HANDLE result;
  char *source_local;
  
  if (source == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                ,"Azure_Base64_Decode",0xc1,1,"invalid parameter const char* source=%p",0);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    sVar3 = strlen(source);
    if ((sVar3 & 3) == 0) {
      l = (LOGGER_LOG)BUFFER_new();
      if ((BUFFER_HANDLE)l == (BUFFER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                    ,"Azure_Base64_Decode",0xd1,1,"Could not create a buffer to decoding.");
        }
      }
      else {
        size = Base64decode_len(source);
        if (size != 0) {
          iVar1 = BUFFER_pre_build((BUFFER_HANDLE)l,size);
          if (iVar1 == 0) {
            decodedString = BUFFER_u_char((BUFFER_HANDLE)l);
            Base64decode(decodedString,source);
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                        ,"Azure_Base64_Decode",0xdc,1,
                        "Could not prebuild a buffer for base 64 decoding.");
            }
            BUFFER_delete((BUFFER_HANDLE)l);
            l = (LOGGER_LOG)0x0;
          }
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/azure_base64.c"
                  ,"Azure_Base64_Decode",0xc9,1,"Invalid length Base64 string!");
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  return (BUFFER_HANDLE)l;
}

Assistant:

BUFFER_HANDLE Azure_Base64_Decode(const char* source)
{
    BUFFER_HANDLE result;
    /*Codes_SRS_BASE64_06_008: [If source is NULL then Azure_Base64_Decode shall return NULL.]*/
    if (source == NULL)
    {
        LogError("invalid parameter const char* source=%p", source);
        result = NULL;
    }
    else
    {
        if ((strlen(source) % 4) != 0)
        {
            /*Codes_SRS_BASE64_06_011: [If the source string has an invalid length for a base 64 encoded string then Azure_Base64_Decode shall return NULL.]*/
            LogError("Invalid length Base64 string!");
            result = NULL;
        }
        else
        {
            if ((result = BUFFER_new()) == NULL)
            {
                /*Codes_SRS_BASE64_06_010: [If there is any memory allocation failure during the decode then Azure_Base64_Decode shall return NULL.]*/
                LogError("Could not create a buffer to decoding.");
            }
            else
            {
                size_t sizeOfOutputBuffer = Base64decode_len(source);
                /*Codes_SRS_BASE64_06_009: [If the string pointed to by source is zero length then the handle returned shall refer to a zero length buffer.]*/
                if (sizeOfOutputBuffer > 0)
                {
                    if (BUFFER_pre_build(result, sizeOfOutputBuffer) != 0)
                    {
                        /*Codes_SRS_BASE64_06_010: [If there is any memory allocation failure during the decode then Azure_Base64_Decode shall return NULL.]*/
                        LogError("Could not prebuild a buffer for base 64 decoding.");
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        Base64decode(BUFFER_u_char(result), source);
                    }
                }
            }
        }
    }
    return result;
}